

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>::
on_finish(tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>
          *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  (*(((this->m_current).
      super___shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    _vptr_tag_t[5])();
  std::
  vector<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>
  ::push_back(&this->m_tags,&this->m_current);
  std::__shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->m_current).
              super___shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
            );
  (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
  return;
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		m_current->on_finish( info );
		m_tags.push_back( m_current );
		m_current.reset();

		this->set_defined();
	}